

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Estimators.cc
# Opt level: O1

void __thiscall Estimate::KF::CalcEstimate(KF *this,VectorXd *y)

{
  Index IVar1;
  undefined8 *puVar2;
  MatrixXd Pyy;
  MatrixXd R;
  MatrixXd K;
  MatrixXd Z;
  MatrixXd Pxy;
  MatrixXd Pbar;
  MatrixXd H;
  assign_op<double,_double> local_119;
  DenseStorage<double,__1,__1,__1,_0> local_118;
  DenseStorage<double,__1,__1,__1,_0> local_100;
  non_const_type local_e8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
  local_e0;
  void *local_a8 [3];
  void *local_90 [3];
  void *local_78 [3];
  DenseStorage<double,__1,__1,__1,_0> local_60;
  DenseStorage<double,__1,__1,__1,_0> local_48;
  
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_48,(DenseStorage<double,__1,__1,__1,_0> *)this);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_100,(DenseStorage<double,__1,__1,__1,_0> *)&this->R_);
  local_e8 = (non_const_type)y;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_60,(DenseStorage<double,__1,__1,__1,_0> *)&this->Pbar_);
  IVar1 = (this->mu_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  local_e0.m_lhs.m_lhs.m_lhs = (LhsNested)&local_60;
  local_e0.m_lhs.m_lhs.m_rhs = (RhsNested)&local_48;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_78,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_e0);
  local_e0.m_rhs.m_lhs.m_lhs = (LhsNested)&local_100;
  local_118.m_data = (double *)0x0;
  local_118.m_rows = 0;
  local_118.m_cols = 0;
  local_e0.m_lhs.m_lhs.m_lhs = (LhsNested)&local_48;
  local_e0.m_lhs.m_lhs.m_rhs = (RhsNested)&local_60;
  local_e0.m_lhs.m_rhs.m_matrix = (non_const_type)&local_48;
  if ((local_100.m_cols != 0 && local_100.m_rows != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_100.m_cols),0) <
      local_100.m_rows)) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = std::ios::widen;
    __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_118,local_100.m_cols * local_100.m_rows,local_100.m_rows,local_100.m_cols);
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const,Eigen::Matrix<double,_1,_1,0,_1,_1>const>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_118,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)&local_e0,(assign_op<double,_double> *)local_a8);
  local_e0.m_lhs.m_lhs.m_lhs = (LhsNested)local_78;
  local_e0.m_lhs.m_lhs.m_rhs = (RhsNested)&local_118;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Inverse<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_a8,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_e0);
  local_e0.m_lhs.m_lhs.m_rhs = (RhsNested)(long)(int)IVar1;
  local_e0.m_lhs.m_rhs.m_matrix = local_e0.m_lhs.m_lhs.m_rhs;
  local_e0.m_rhs.m_lhs.m_rhs = (RhsNested)local_a8;
  local_e0.m_rhs.m_rhs.m_matrix = (non_const_type)&local_48;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_90,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>_>
              *)&local_e0);
  local_e0.m_rhs.m_lhs.m_rhs = (RhsNested)&local_100;
  local_e0.m_lhs.m_lhs.m_lhs = (LhsNested)local_90;
  local_e0.m_lhs.m_lhs.m_rhs = (RhsNested)&local_60;
  local_e0.m_lhs.m_rhs.m_matrix = (non_const_type)local_90;
  local_e0.m_rhs.m_lhs.m_lhs = (LhsNested)local_a8;
  local_e0.m_rhs.m_rhs.m_matrix = (non_const_type)local_a8;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const,Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,0>const>,Eigen::internal::assign_op<double,double>>
            (&this->Phat_,&local_e0,&local_119,(type)0x0);
  local_e0.m_lhs.m_lhs.m_lhs = (LhsNested)&this->mu_;
  local_e0.m_lhs.m_rhs.m_matrix = local_e8;
  local_e0.m_lhs.m_lhs.m_rhs = (RhsNested)local_a8;
  local_e0.m_rhs.m_lhs.m_lhs = (LhsNested)&local_48;
  local_e0.m_rhs.m_lhs.m_rhs = local_e0.m_lhs.m_lhs.m_lhs;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>,0>const>,Eigen::internal::assign_op<double,double>>
            (&this->xhat_,
             (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>,_0>_>
              *)&local_e0,&local_119,(type)0x0);
  free(local_90[0]);
  free(local_a8[0]);
  free(local_118.m_data);
  free(local_78[0]);
  free(local_60.m_data);
  free(local_100.m_data);
  free(local_48.m_data);
  return;
}

Assistant:

void KF::CalcEstimate(Eigen::VectorXd y){

		//extract locals
		Eigen::MatrixXd H = this->H_;
		Eigen::MatrixXd R = this->R_;
		Eigen::MatrixXd Pbar = this->Pbar_;
		int N_x = this->mu_.size();

		// find kalman gain
		Eigen::MatrixXd Pxy = Pbar*H.transpose();
		Eigen::MatrixXd Pyy = H*Pbar*H.transpose() + R;
		Eigen::MatrixXd K = Pxy*Pyy.inverse();

		//covariance
		Eigen::MatrixXd Z = Eigen::MatrixXd::Identity(N_x,N_x) - K*H;
		this->Phat_ = Z*Pbar*Z.transpose() + K*R*K.transpose();

		//estimate
		this->xhat_ = this->mu_ + K*(y - H*this->mu_);


	}